

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O0

void M_RestoreMode(void)

{
  NewWidth = OldWidth;
  NewHeight = OldHeight;
  NewBits = OldBits;
  setmodeneeded = true;
  testingmode = 0;
  SetModesMenu(OldWidth,OldHeight,OldBits);
  return;
}

Assistant:

void M_RestoreMode ()
{
	NewWidth = OldWidth;
	NewHeight = OldHeight;
	NewBits = OldBits;
	setmodeneeded = true;
	testingmode = 0;
	SetModesMenu (OldWidth, OldHeight, OldBits);
}